

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

string * __thiscall
LTFlightData::FDStaticData::flightRoute_abi_cxx11_
          (string *__return_storage_ptr__,FDStaticData *this)

{
  string *__return_storage_ptr___00;
  string r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  __return_storage_ptr___00 = &local_38;
  route_abi_cxx11_(__return_storage_ptr___00,this);
  if ((this->flight)._M_string_length == 0) {
    if (local_38._M_string_length == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_0015982b;
    }
  }
  else {
    __return_storage_ptr___00 = &this->flight;
    if (local_38._M_string_length != 0) {
      std::operator+(&bStack_58,__return_storage_ptr___00,": ");
      std::operator+(__return_storage_ptr__,&bStack_58,&local_38);
      std::__cxx11::string::~string((string *)&bStack_58);
      goto LAB_0015982b;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__return_storage_ptr___00)
  ;
LAB_0015982b:
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string LTFlightData::FDStaticData::flightRoute() const
{
    const std::string r(route());
    // keep it an empty string if there is no info at all
    if (flight.empty() && r.empty())
        return std::string();
    
    // if there is some info missing then just return the other
    if (flight.empty())
        return r;
    if (r.empty())
        return flight;
    
    // we have both...put it together
    return (flight + ": ") + r;
}